

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestInfo *pTVar1;
  TestCase *pTVar2;
  bool bVar3;
  TestCase *pTVar4;
  reference ppTVar5;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar6;
  TestInfo *pTVar7;
  const_reference ppTVar8;
  char *pcVar9;
  FILE *pFVar10;
  undefined8 uVar11;
  ostream *local_368;
  ostream *local_358;
  string local_300;
  string local_2e0 [32];
  JsonUnitTestResultPrinter local_2c0;
  string local_298 [32];
  XmlUnitTestResultPrinter local_278;
  stringstream local_250 [8];
  stringstream stream;
  ostream aoStack_240 [383];
  allocator local_c1;
  string local_c0 [32];
  string local_a0;
  FILE *local_80;
  FILE *fileout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string *output_format;
  TestInfo *test_info;
  size_t j;
  value_type pTStack_28;
  bool printed_test_case_name;
  TestCase *test_case;
  size_t i;
  UnitTestImpl *pUStack_10;
  int kMaxParamLength;
  UnitTestImpl *this_local;
  
  i._4_4_ = 0xfa;
  pUStack_10 = this;
  for (test_case = (TestCase *)0x0; pTVar2 = test_case,
      pTVar4 = (TestCase *)
               std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                         (&this->test_cases_), pTVar2 < pTVar4;
      test_case = (TestCase *)((long)&test_case->_vptr_TestCase + 1)) {
    ppTVar5 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,(size_type)test_case);
    pTStack_28 = *ppTVar5;
    j._7_1_ = 0;
    test_info = (TestInfo *)0x0;
    while( true ) {
      pTVar1 = test_info;
      pvVar6 = TestCase::test_info_list(pTStack_28);
      pTVar7 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar6);
      if (pTVar7 <= pTVar1) break;
      pvVar6 = TestCase::test_info_list(pTStack_28);
      ppTVar8 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar6,(size_type)test_info);
      output_format = &(*ppTVar8)->test_case_name_;
      if ((((value_type)output_format)->matches_filter_ & 1U) != 0) {
        if ((j._7_1_ & 1) == 0) {
          j._7_1_ = 1;
          pcVar9 = TestCase::name(pTStack_28);
          printf("%s.",pcVar9);
          pcVar9 = TestCase::type_param(pTStack_28);
          if (pcVar9 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            pcVar9 = TestCase::type_param(pTStack_28);
            PrintOnOneLine(pcVar9,0xfa);
          }
          printf("\n");
        }
        pcVar9 = TestInfo::name((TestInfo *)output_format);
        printf("  %s",pcVar9);
        pcVar9 = TestInfo::value_param((TestInfo *)output_format);
        if (pcVar9 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          pcVar9 = TestInfo::value_param((TestInfo *)output_format);
          PrintOnOneLine(pcVar9,0xfa);
        }
        printf("\n");
      }
      test_info = (TestInfo *)&(test_info->test_case_name_).field_0x1;
    }
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_48 = &local_68;
  bVar3 = std::operator==(&local_68,"xml");
  if ((bVar3) || (bVar3 = std::operator==(local_48,"json"), bVar3)) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar9,&local_c1);
    pFVar10 = (FILE *)OpenFileForWriting(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_c0);
    local_80 = pFVar10;
    std::__cxx11::stringstream::stringstream(local_250);
    bVar3 = std::operator==(local_48,"xml");
    if (bVar3) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(&local_278,pcVar9);
      local_358 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x250) {
        local_358 = aoStack_240;
      }
      XmlUnitTestResultPrinter::PrintXmlTestsList(local_358,&this->test_cases_);
      XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter(&local_278);
      std::__cxx11::string::~string(local_298);
    }
    else {
      bVar3 = std::operator==(local_48,"json");
      if (bVar3) {
        UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(&local_2c0,pcVar9);
        local_368 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x250) {
          local_368 = aoStack_240;
        }
        JsonUnitTestResultPrinter::PrintJsonTestList(local_368,&this->test_cases_);
        JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter(&local_2c0);
        std::__cxx11::string::~string(local_2e0);
      }
    }
    pFVar10 = local_80;
    StringStreamToString(&local_300,(stringstream *)local_250);
    uVar11 = std::__cxx11::string::c_str();
    fprintf(pFVar10,"%s",uVar11);
    std::__cxx11::string::~string((string *)&local_300);
    fclose(local_80);
    std::__cxx11::stringstream::~stringstream(local_250);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_cases_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_cases_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}